

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_typeof(lua_State *L)

{
  CTState *cts;
  uint64_t uVar1;
  CTypeID CVar2;
  void *pvVar3;
  
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  CVar2 = ffi_checkctype(L,cts,L->base + 1);
  pvVar3 = lj_mem_newgco(cts->L,0x14);
  *(undefined1 *)((long)pvVar3 + 9) = 10;
  *(undefined2 *)((long)pvVar3 + 10) = 0x16;
  *(CTypeID *)((long)pvVar3 + 0x10) = CVar2;
  L->top[-1].u64 = (ulong)pvVar3 | 0xfffa800000000000;
  uVar1 = (L->glref).ptr64;
  if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_typeof)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, L->base+1);
  GCcdata *cd = lj_cdata_new(cts, CTID_CTYPEID, 4);
  *(CTypeID *)cdataptr(cd) = id;
  setcdataV(L, L->top-1, cd);
  lj_gc_check(L);
  return 1;
}